

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O2

void __thiscall CDataFileReader::GetType(CDataFileReader *this,int Type,int *pStart,int *pNum)

{
  uint uVar1;
  CDatafile *pCVar2;
  CDatafileItemType *pCVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  *pStart = 0;
  *pNum = 0;
  pCVar2 = this->m_pDataFile;
  if (pCVar2 != (CDatafile *)0x0) {
    uVar1 = (pCVar2->m_Header).m_NumItemTypes;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = 0;
    }
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (uVar6 * 0xc + 0xc == uVar5 + 0xc) {
        return;
      }
      pCVar3 = (pCVar2->m_Info).m_pItemTypes;
      uVar4 = uVar5 + 0xc;
    } while (*(int *)((long)&pCVar3->m_Type + uVar5) != Type);
    *pStart = *(int *)((long)&pCVar3->m_Start + uVar5);
    *pNum = *(int *)((long)&pCVar3->m_Num + uVar5);
  }
  return;
}

Assistant:

void CDataFileReader::GetType(int Type, int *pStart, int *pNum)
{
	*pStart = 0;
	*pNum = 0;

	if(!m_pDataFile)
		return;

	for(int i = 0; i < m_pDataFile->m_Header.m_NumItemTypes; i++)
	{
		if(m_pDataFile->m_Info.m_pItemTypes[i].m_Type == Type)
		{
			*pStart = m_pDataFile->m_Info.m_pItemTypes[i].m_Start;
			*pNum = m_pDataFile->m_Info.m_pItemTypes[i].m_Num;
			return;
		}
	}
}